

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_reservoir_sample.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalReservoirSample::Sink
          (PhysicalReservoirSample *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  __pthread_list_t *this_00;
  GlobalSinkState *pGVar1;
  __pthread_internal_list *p_Var2;
  __pthread_internal_list *p_Var3;
  pointer pBVar4;
  Allocator *args;
  pointer pSVar5;
  SinkResultType SVar6;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *this_01;
  double percentage;
  __pthread_internal_list *local_48;
  double local_40;
  idx_t local_38;
  
  pGVar1 = input->global_state;
  ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(pGVar1 + 1))->__data);
  this_00 = &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list;
  if (pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__prev
      == (__pthread_internal_list *)0x0) {
    args = Allocator::Get(context->client);
    this_01 = &this->options;
    pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
             operator->(this_01);
    if (pSVar5->is_percentage == true) {
      pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
               operator->(this_01);
      local_40 = Value::GetValue<double>(&pSVar5->sample_size);
      if ((local_40 == 0.0) && (!NAN(local_40))) {
LAB_009a930c:
        SVar6 = FINISHED;
        goto LAB_009a9205;
      }
      pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
               operator->(this_01);
      local_38 = optional_idx::GetIndex(&pSVar5->seed);
      make_uniq<duckdb::ReservoirSamplePercentage,duckdb::Allocator&,double&,long>
                ((duckdb *)&local_48,args,&local_40,(long *)&local_38);
    }
    else {
      pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
               operator->(this_01);
      local_40 = (double)Value::GetValue<unsigned_long>(&pSVar5->sample_size);
      if (local_40 == 0.0) goto LAB_009a930c;
      pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
               operator->(this_01);
      local_38 = optional_idx::GetIndex(&pSVar5->seed);
      make_uniq<duckdb::ReservoirSample,duckdb::Allocator&,unsigned_long&,long>
                ((duckdb *)&local_48,args,(unsigned_long *)&local_40,(long *)&local_38);
    }
    p_Var3 = local_48;
    local_48 = (__pthread_internal_list *)0x0;
    p_Var2 = this_00->__prev;
    this_00->__prev = p_Var3;
    if (p_Var2 != (__pthread_internal_list *)0x0) {
      (*(code *)p_Var2->__prev->__next)();
      if (local_48 != (__pthread_internal_list *)0x0) {
        (*(code *)local_48->__prev->__next)();
      }
    }
  }
  pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this_00);
  (*pBVar4->_vptr_BlockingSample[2])(pBVar4,chunk);
  SVar6 = NEED_MORE_INPUT;
LAB_009a9205:
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar1 + 1));
  return SVar6;
}

Assistant:

SinkResultType PhysicalReservoirSample::Sink(ExecutionContext &context, DataChunk &chunk,
                                             OperatorSinkInput &input) const {
	auto &global_state = input.global_state.Cast<SampleGlobalSinkState>();
	// Percentage only has a global sample.
	lock_guard<mutex> glock(global_state.lock);
	if (!global_state.sample) {
		// always gather full thread percentage
		auto &allocator = Allocator::Get(context.client);
		if (options->is_percentage) {
			double percentage = options->sample_size.GetValue<double>();
			if (percentage == 0) {
				return SinkResultType::FINISHED;
			}
			global_state.sample = make_uniq<ReservoirSamplePercentage>(allocator, percentage,
			                                                           static_cast<int64_t>(options->seed.GetIndex()));
		} else {
			idx_t num_samples = options->sample_size.GetValue<idx_t>();
			if (num_samples == 0) {
				return SinkResultType::FINISHED;
			}
			global_state.sample =
			    make_uniq<ReservoirSample>(allocator, num_samples, static_cast<int64_t>(options->seed.GetIndex()));
		}
	}
	global_state.sample->AddToReservoir(chunk);
	return SinkResultType::NEED_MORE_INPUT;
}